

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_list.hpp
# Opt level: O0

int iutest::detail::CountIf<iutest::TestInfo*,bool(*)(iutest::TestInfo_const*)>
              (vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_> *list,
              _func_bool_TestInfo_ptr *f)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<iutest::TestInfo_*const_*,_std::vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  int count;
  _func_bool_TestInfo_ptr *f_local;
  vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_> *list_local;
  
  it._M_current._4_4_ = 0;
  end = std::vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>::begin(list);
  local_30._M_current =
       (TestInfo **)std::vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>::end(list);
  while (bVar1 = __gnu_cxx::operator!=(&end,&local_30), bVar1) {
    ppTVar2 = __gnu_cxx::
              __normal_iterator<iutest::TestInfo_*const_*,_std::vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>_>
              ::operator*(&end);
    bVar1 = (*f)(*ppTVar2);
    if (bVar1) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<iutest::TestInfo_*const_*,_std::vector<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>_>
    ::operator++(&end);
  }
  return it._M_current._4_4_;
}

Assistant:

int CountIf(const ::std::vector<T>& list, Fn f)
{
    int count = 0;
    for(typename ::std::vector<T>::const_iterator it = list.begin(), end = list.end(); it != end; ++it)
    {
        if(f(*it))
        {
            ++count;
        }
    }
    return count;
}